

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.h
# Opt level: O2

void __thiscall
kj::_::
RunnableImpl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-test.c++:2114:5)>
::run(RunnableImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_io_test_c__:2114:5)>
      *this)

{
  StringPtr expected;
  Own<kj::_::PromiseNode> local_20;
  
  expected.content.size_ = (size_t)"o";
  expected.content.ptr = (char *)((this->func).right)->ptr;
  kj::anon_unknown_0::expectRead((AsyncInputStream *)&local_20,expected);
  Promise<void>::wait((Promise<void> *)&local_20,(this->func).ws);
  Own<kj::_::PromiseNode>::dispose(&local_20);
  return;
}

Assistant:

void run() override {
    func();
  }